

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_reader.cpp
# Opt level: O1

idx_t __thiscall
duckdb::ListColumnReader::ReadInternal<duckdb::TemplatedListReader>
          (ListColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          optional_ptr<duckdb::Vector,_true> result_out)

{
  ParquetColumnSchema *pPVar1;
  VectorCache *pVVar2;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *this_00;
  int iVar3;
  pointer pCVar4;
  undefined4 extraout_var;
  idx_t iVar5;
  long lVar6;
  ulong uVar7;
  idx_t offset;
  ulong uVar8;
  ulong uVar9;
  data_ptr_t pdVar10;
  data_ptr_t pdVar11;
  bool bVar12;
  DATA data;
  optional_ptr<duckdb::Vector,_true> local_88;
  VectorCache *local_80;
  idx_t local_78;
  ulong local_70;
  Vector *local_68;
  data_ptr_t local_60;
  data_ptr_t local_58;
  DATA local_50;
  VectorCache *local_40;
  unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true> *local_38;
  undefined4 extraout_var_00;
  
  local_78 = num_values;
  local_68 = result_out.ptr;
  local_60 = define_out;
  local_58 = repeat_out;
  local_50 = TemplatedListReader::Initialize((optional_ptr<duckdb::Vector,_true>)0x33b411);
  local_38 = &this->child_column_reader;
  local_80 = (VectorCache *)&this->read_vector;
  local_40 = &this->read_cache;
  local_70 = 0;
  offset = 0;
  do {
    if ((local_70 & 1) != 0) {
      return offset;
    }
    iVar5 = this->overflow_child_count;
    if (iVar5 == 0) {
      memset((this->child_defines).super_ByteBuffer.ptr,0,(this->child_defines).super_ByteBuffer.len
            );
      memset((this->child_repeats).super_ByteBuffer.ptr,0,(this->child_repeats).super_ByteBuffer.len
            );
      this_00 = local_38;
      pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(local_38);
      iVar3 = (*pCVar4->_vptr_ColumnReader[9])(pCVar4);
      pVVar2 = local_80;
      uVar7 = CONCAT44(extraout_var,iVar3);
      if (0x7ff < uVar7) {
        uVar7 = 0x800;
      }
      duckdb::Vector::ResetFromCache(local_80);
      pCVar4 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
               operator->(this_00);
      iVar3 = (*pCVar4->_vptr_ColumnReader[3])
                        (pCVar4,uVar7,this->child_defines_ptr,this->child_repeats_ptr,pVVar2);
      iVar5 = CONCAT44(extraout_var_00,iVar3);
    }
    else {
      this->overflow_child_count = 0;
    }
    if (iVar5 != 0) {
      duckdb::Vector::Verify((ulong)local_80);
      local_88.ptr = local_68;
      optional_ptr<duckdb::Vector,_true>::CheckValid(&local_88);
      lVar6 = duckdb::ListVector::GetListSize(local_88.ptr);
      bVar12 = true;
      uVar8 = 0;
      pdVar10 = local_58;
      pdVar11 = local_60;
      uVar7 = local_78;
      do {
        pPVar1 = (this->super_ColumnReader).column_schema;
        if (pPVar1->max_repeat == (ulong)this->child_repeats_ptr[uVar8]) {
          local_50.result_ptr[offset - 1].length = local_50.result_ptr[offset - 1].length + 1;
        }
        else {
          if (uVar7 <= offset) {
            local_70 = CONCAT71((int7)((ulong)pPVar1 >> 8),1);
            uVar9 = uVar8;
            break;
          }
          if ((ulong)this->child_defines_ptr[uVar8] < pPVar1->max_define) {
            if (pPVar1->max_define - 1 == (ulong)this->child_defines_ptr[uVar8]) {
              local_50.result_ptr[offset].offset = lVar6 + uVar8;
              local_50.result_ptr[offset].length = 0;
            }
            else {
              TemplatedListReader::HandleNull(&local_50,offset);
              pdVar10 = local_58;
              pdVar11 = local_60;
              uVar7 = local_78;
            }
          }
          else {
            local_50.result_ptr[offset].offset = lVar6 + uVar8;
            local_50.result_ptr[offset].length = 1;
          }
          if (pdVar10 != (data_ptr_t)0x0) {
            pdVar10[offset] = this->child_repeats_ptr[uVar8];
          }
          if (pdVar11 != (data_ptr_t)0x0) {
            pdVar11[offset] = this->child_defines_ptr[uVar8];
          }
          offset = offset + 1;
        }
        uVar8 = uVar8 + 1;
        bVar12 = uVar8 < iVar5;
        uVar9 = iVar5;
      } while (uVar8 != iVar5);
      local_88.ptr = local_68;
      optional_ptr<duckdb::Vector,_true>::CheckValid(&local_88);
      duckdb::ListVector::Append(local_88.ptr,(Vector *)local_80,uVar9,0);
      pVVar2 = local_80;
      if ((bVar12) && (offset == local_78)) {
        duckdb::Vector::Slice((Vector *)local_80,(ulong)local_80,uVar9);
        this->overflow_child_count = iVar5 - uVar9;
        duckdb::Vector::Verify((ulong)pVVar2);
        if (this->overflow_child_count != 0) {
          uVar7 = 0;
          do {
            this->child_defines_ptr[uVar7] = this->child_defines_ptr[uVar9 + uVar7];
            this->child_repeats_ptr[uVar7] = this->child_repeats_ptr[uVar9 + uVar7];
            uVar7 = uVar7 + 1;
          } while (uVar7 < this->overflow_child_count);
        }
      }
    }
    if (iVar5 == 0) {
      return offset;
    }
  } while( true );
}

Assistant:

idx_t ListColumnReader::ReadInternal(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out,
                                     optional_ptr<Vector> result_out) {
	idx_t result_offset = 0;
	auto data = OP::Initialize(result_out);

	// if an individual list is longer than STANDARD_VECTOR_SIZE we actually have to loop the child read to fill it
	bool finished = false;
	while (!finished) {
		idx_t child_actual_num_values = 0;

		// check if we have any overflow from a previous read
		if (overflow_child_count == 0) {
			// we don't: read elements from the child reader
			child_defines.zero();
			child_repeats.zero();
			// we don't know in advance how many values to read because of the beautiful repetition/definition setup
			// we just read (up to) a vector from the child column, and see if we have read enough
			// if we have not read enough, we read another vector
			// if we have read enough, we leave any unhandled elements in the overflow vector for a subsequent read
			auto child_req_num_values =
			    MinValue<idx_t>(STANDARD_VECTOR_SIZE, child_column_reader->GroupRowsAvailable());
			read_vector.ResetFromCache(read_cache);
			child_actual_num_values =
			    child_column_reader->Read(child_req_num_values, child_defines_ptr, child_repeats_ptr, read_vector);
		} else {
			// we do: use the overflow values
			child_actual_num_values = overflow_child_count;
			overflow_child_count = 0;
		}

		if (child_actual_num_values == 0) {
			// no more elements available: we are done
			break;
		}
		read_vector.Verify(child_actual_num_values);
		idx_t current_chunk_offset = OP::GetOffset(result_out);

		// hard-won piece of code this, modify at your own risk
		// the intuition is that we have to only collapse values into lists that are repeated *on this level*
		// the rest is pretty much handed up as-is as a single-valued list or NULL
		idx_t child_idx;
		for (child_idx = 0; child_idx < child_actual_num_values; child_idx++) {
			if (child_repeats_ptr[child_idx] == MaxRepeat()) {
				// value repeats on this level, append
				D_ASSERT(result_offset > 0);
				OP::HandleRepeat(data, result_offset - 1);
				continue;
			}

			if (result_offset >= num_values) {
				// we ran out of output space
				finished = true;
				break;
			}
			if (child_defines_ptr[child_idx] >= MaxDefine()) {
				// value has been defined down the stack, hence its NOT NULL
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 1);
			} else if (child_defines_ptr[child_idx] == MaxDefine() - 1) {
				// empty list
				OP::HandleListStart(data, result_offset, child_idx + current_chunk_offset, 0);
			} else {
				// value is NULL somewhere up the stack
				OP::HandleNull(data, result_offset);
			}

			if (repeat_out) {
				repeat_out[result_offset] = child_repeats_ptr[child_idx];
			}
			if (define_out) {
				define_out[result_offset] = child_defines_ptr[child_idx];
			}

			result_offset++;
		}
		// actually append the required elements to the child list
		OP::AppendVector(result_out, read_vector, child_idx);

		// we have read more values from the child reader than we can fit into the result for this read
		// we have to pass everything from child_idx to child_actual_num_values into the next call
		if (child_idx < child_actual_num_values && result_offset == num_values) {
			read_vector.Slice(read_vector, child_idx, child_actual_num_values);
			overflow_child_count = child_actual_num_values - child_idx;
			read_vector.Verify(overflow_child_count);

			// move values in the child repeats and defines *backward* by child_idx
			for (idx_t repdef_idx = 0; repdef_idx < overflow_child_count; repdef_idx++) {
				child_defines_ptr[repdef_idx] = child_defines_ptr[child_idx + repdef_idx];
				child_repeats_ptr[repdef_idx] = child_repeats_ptr[child_idx + repdef_idx];
			}
		}
	}
	return result_offset;
}